

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyHaig.c
# Opt level: O3

void Ivy_ManHaigCreateObj(Ivy_Man_t *p,Ivy_Obj_t *pObj)

{
  int iVar1;
  Ivy_Man_t *p_00;
  uint uVar2;
  Ivy_Obj_t *pIVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  p_00 = p->pHaig;
  if (p_00 == (Ivy_Man_t *)0x0) {
    __assert_fail("p->pHaig != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyHaig.c"
                  ,0xba,"void Ivy_ManHaigCreateObj(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Ivy_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyHaig.c"
                  ,0xbb,"void Ivy_ManHaigCreateObj(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  uVar2 = *(uint *)&pObj->field_0x8 & 0xf;
  if (uVar2 == 4) {
    uVar4 = (ulong)pObj->pFanin0 & 0xfffffffffffffffe;
    if (uVar4 == 0) {
      uVar4 = 0;
    }
    else {
      uVar4 = (ulong)((uint)pObj->pFanin0 & 1) ^ *(ulong *)(uVar4 + 0x48);
    }
    uVar8 = uVar4 & 0xfffffffffffffffe;
    uVar5 = *(ulong *)(uVar8 + 0x48);
    if ((uVar5 != 0) && (*(int *)(uVar8 + 0xc) < 1)) {
      uVar7 = uVar5 & 0xfffffffffffffffe;
      uVar6 = uVar8;
      if (uVar7 != uVar8) {
        iVar1 = *(int *)(uVar7 + 0xc);
        while ((uVar6 = uVar7, iVar1 < 1 &&
               (uVar7 = *(ulong *)(uVar7 + 0x48) & 0xfffffffffffffffe, uVar6 = uVar8, uVar7 != uVar8
               ))) {
          iVar1 = *(int *)(uVar7 + 0xc);
        }
      }
      if (*(int *)(uVar7 + 0xc) < 1) {
LAB_007a6d4b:
        __assert_fail("Ivy_ObjRefs(pTemp) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyHaig.c"
                      ,0x3b,"Ivy_Obj_t *Ivy_HaigObjRepr(Ivy_Obj_t *)");
      }
      uVar8 = uVar6 | (uint)uVar5 & 1;
    }
    pIVar3 = Ivy_Latch(p_00,(Ivy_Obj_t *)((uint)uVar4 & 1 ^ uVar8),
                       *(uint *)&pObj->field_0x8 >> 9 & IVY_INIT_DC);
  }
  else if (uVar2 == 5) {
    uVar4 = (ulong)pObj->pFanin0 & 0xfffffffffffffffe;
    if (uVar4 == 0) {
      uVar4 = 0;
    }
    else {
      uVar4 = (ulong)((uint)pObj->pFanin0 & 1) ^ *(ulong *)(uVar4 + 0x48);
    }
    uVar8 = uVar4 & 0xfffffffffffffffe;
    uVar5 = *(ulong *)(uVar8 + 0x48);
    if ((uVar5 != 0) && (*(int *)(uVar8 + 0xc) < 1)) {
      uVar7 = uVar5 & 0xfffffffffffffffe;
      uVar6 = uVar8;
      if (uVar7 != uVar8) {
        iVar1 = *(int *)(uVar7 + 0xc);
        while ((uVar6 = uVar7, iVar1 < 1 &&
               (uVar7 = *(ulong *)(uVar7 + 0x48) & 0xfffffffffffffffe, uVar6 = uVar8, uVar7 != uVar8
               ))) {
          iVar1 = *(int *)(uVar7 + 0xc);
        }
      }
      if (*(int *)(uVar7 + 0xc) < 1) goto LAB_007a6d4b;
      uVar8 = uVar6 | (uint)uVar5 & 1;
    }
    uVar5 = (ulong)pObj->pFanin1 & 0xfffffffffffffffe;
    if (uVar5 == 0) {
      uVar5 = 0;
    }
    else {
      uVar5 = (ulong)((uint)pObj->pFanin1 & 1) ^ *(ulong *)(uVar5 + 0x48);
    }
    uVar6 = uVar5 & 0xfffffffffffffffe;
    uVar7 = *(ulong *)(uVar6 + 0x48);
    if ((uVar7 != 0) && (*(int *)(uVar6 + 0xc) < 1)) {
      uVar9 = uVar7 & 0xfffffffffffffffe;
      uVar10 = uVar6;
      if (uVar9 != uVar6) {
        iVar1 = *(int *)(uVar9 + 0xc);
        while ((uVar10 = uVar9, iVar1 < 1 &&
               (uVar9 = *(ulong *)(uVar9 + 0x48) & 0xfffffffffffffffe, uVar10 = uVar6,
               uVar9 != uVar6))) {
          iVar1 = *(int *)(uVar9 + 0xc);
        }
      }
      if (*(int *)(uVar9 + 0xc) < 1) goto LAB_007a6d4b;
      uVar6 = uVar10 | (uint)uVar7 & 1;
    }
    pIVar3 = Ivy_And(p_00,(Ivy_Obj_t *)(uVar8 ^ (uint)uVar4 & 1),
                     (Ivy_Obj_t *)((uint)uVar5 & 1 ^ uVar6));
  }
  else {
    if (uVar2 != 7) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyHaig.c"
                    ,0xce,"void Ivy_ManHaigCreateObj(Ivy_Man_t *, Ivy_Obj_t *)");
    }
    uVar4 = (ulong)pObj->pFanin0 & 0xfffffffffffffffe;
    if (uVar4 == 0) {
      pIVar3 = (Ivy_Obj_t *)0x0;
    }
    else {
      pIVar3 = (Ivy_Obj_t *)((ulong)((uint)pObj->pFanin0 & 1) ^ *(ulong *)(uVar4 + 0x48));
    }
  }
  pObj->pEquiv = pIVar3;
  return;
}

Assistant:

void Ivy_ManHaigCreateObj( Ivy_Man_t * p, Ivy_Obj_t * pObj )
{
    Ivy_Obj_t * pEquiv0, * pEquiv1;
    assert( p->pHaig != NULL );
    assert( !Ivy_IsComplement(pObj) );
    if ( Ivy_ObjType(pObj) == IVY_BUF )
        pObj->pEquiv = Ivy_ObjChild0Equiv(pObj);
    else if ( Ivy_ObjType(pObj) == IVY_LATCH )
    {
//        pObj->pEquiv = Ivy_Latch( p->pHaig, Ivy_ObjChild0Equiv(pObj), pObj->Init );
        pEquiv0 = Ivy_ObjChild0Equiv(pObj);
        pEquiv0 = Ivy_NotCond( Ivy_HaigObjRepr(Ivy_Regular(pEquiv0)), Ivy_IsComplement(pEquiv0) );
        pObj->pEquiv = Ivy_Latch( p->pHaig, pEquiv0, (Ivy_Init_t)pObj->Init );
    }
    else if ( Ivy_ObjType(pObj) == IVY_AND )
    {
//        pObj->pEquiv = Ivy_And( p->pHaig, Ivy_ObjChild0Equiv(pObj), Ivy_ObjChild1Equiv(pObj) );
        pEquiv0 = Ivy_ObjChild0Equiv(pObj);
        pEquiv0 = Ivy_NotCond( Ivy_HaigObjRepr(Ivy_Regular(pEquiv0)), Ivy_IsComplement(pEquiv0) );
        pEquiv1 = Ivy_ObjChild1Equiv(pObj);
        pEquiv1 = Ivy_NotCond( Ivy_HaigObjRepr(Ivy_Regular(pEquiv1)), Ivy_IsComplement(pEquiv1) );
        pObj->pEquiv = Ivy_And( p->pHaig, pEquiv0, pEquiv1 );
    }
    else assert( 0 );
    // make sure the node points to the representative
//    pObj->pEquiv = Ivy_NotCond( Ivy_HaigObjRepr(Ivy_Regular(pObj->pEquiv)), Ivy_IsComplement(pObj->pEquiv) );
}